

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

void Cba_NtkAddMissingFonNames(Cba_Ntk_t *p,char *pPref)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  Cba_Man_t *pCVar5;
  ulong uVar6;
  ulong uVar7;
  
  pCVar5 = p->pDesign;
  if (0 < (pCVar5->vUsed).nSize) {
    piVar1 = (pCVar5->vUsed).pArray;
    lVar4 = 0;
    do {
      iVar2 = piVar1[lVar4];
      if (((long)iVar2 < 0) || ((pCVar5->vNameMap).nSize <= iVar2)) goto LAB_0033b718;
      (pCVar5->vNameMap).pArray[iVar2] = 0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pCVar5->vUsed).nSize);
  }
  (pCVar5->vUsed).nSize = 0;
  iVar2 = (p->vFonName).nSize;
  if (1 < iVar2) {
    lVar4 = 1;
    do {
      uVar3 = (p->vFonName).pArray[lVar4];
      uVar7 = (ulong)uVar3;
      if (uVar7 != 0) {
        pCVar5 = p->pDesign;
        Vec_IntFillExtra(&pCVar5->vNameMap,uVar3 + 1,0);
        if (((int)uVar3 < 0) || ((pCVar5->vNameMap).nSize <= (int)uVar3)) goto LAB_0033b6f9;
        if ((pCVar5->vNameMap).pArray[uVar7] != 0) goto LAB_0033b737;
        Vec_IntFillExtra(&pCVar5->vNameMap,uVar3 + 1,0);
        if ((pCVar5->vNameMap).nSize <= (int)uVar3) goto LAB_0033b718;
        (pCVar5->vNameMap).pArray[uVar7] = (int)lVar4;
        Vec_IntPush(&pCVar5->vUsed,uVar3);
        iVar2 = (p->vFonName).nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
    if (1 < iVar2) {
      uVar7 = 1;
      do {
        if ((p->vFonName).pArray[uVar7] == 0) {
          uVar3 = Cba_NtkNewStrId(p,"%s%d",pPref,uVar7 & 0xffffffff);
          pCVar5 = p->pDesign;
          iVar2 = uVar3 + 1;
          Vec_IntFillExtra(&pCVar5->vNameMap,iVar2,0);
          if ((int)uVar3 < 0) {
LAB_0033b6f9:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar6 = 1;
          while( true ) {
            if ((pCVar5->vNameMap).nSize <= (int)uVar3) goto LAB_0033b6f9;
            if ((pCVar5->vNameMap).pArray[uVar3] == 0) break;
            uVar3 = Cba_NtkNewStrId(p,"%s%d_%d",pPref,uVar7 & 0xffffffff,uVar6);
            uVar6 = (ulong)((int)uVar6 + 1);
            pCVar5 = p->pDesign;
            iVar2 = uVar3 + 1;
            Vec_IntFillExtra(&pCVar5->vNameMap,iVar2,0);
            if ((int)uVar3 < 0) goto LAB_0033b6f9;
          }
          Cba_FonSetName(p,(int)uVar7,uVar3);
          pCVar5 = p->pDesign;
          Vec_IntFillExtra(&pCVar5->vNameMap,iVar2,0);
          if ((pCVar5->vNameMap).nSize <= (int)uVar3) goto LAB_0033b6f9;
          if ((pCVar5->vNameMap).pArray[uVar3] != 0) {
LAB_0033b737:
            __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                          ,0x37b,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
          }
          Vec_IntFillExtra(&pCVar5->vNameMap,iVar2,0);
          if ((pCVar5->vNameMap).nSize <= (int)uVar3) {
LAB_0033b718:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pCVar5->vNameMap).pArray[uVar3] = (int)uVar7;
          Vec_IntPush(&pCVar5->vUsed,uVar3);
          iVar2 = (p->vFonName).nSize;
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)iVar2);
    }
  }
  return;
}

Assistant:

static inline void Cba_NtkAddMissingFonNames( Cba_Ntk_t * p, char * pPref )
{
    int iFon, NameId, Index;
    // populate map
    Cba_ManCleanMap( p->pDesign );
    Vec_IntForEachEntryStart( &p->vFonName, NameId, iFon, 1 )
        if ( NameId )
            Cba_ManSetMap( p->pDesign, NameId, iFon );
    // check remaining ones
    Vec_IntForEachEntryStart( &p->vFonName, NameId, iFon, 1 )
    {
        if ( NameId )
            continue;
        NameId = Cba_NtkNewStrId(p, "%s%d", pPref, iFon);
        for ( Index = 1; Cba_ManGetMap(p->pDesign, NameId); Index++ )
            NameId = Cba_NtkNewStrId(p, "%s%d_%d", pPref, iFon, Index);
        Cba_FonSetName( p, iFon, NameId );
        Cba_ManSetMap( p->pDesign, NameId, iFon );
    }
}